

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

int32_t lj_ffrecord_select_mode(jit_State *J,TRef tr,TValue *tv)

{
  IRRef1 IVar1;
  int32_t iVar3;
  IROpT IVar4;
  GCobj *o;
  TRef TVar2;
  
  if (((tr & 0x1f000000) == 0x4000000) &&
     (o = (GCobj *)(tv->u64 & 0x7fffffffffff), (char)(o->gch).gclist.gcptr64 == '#')) {
    if ((o->str).len == 1) {
      TVar2 = lj_ir_kgc(J,o,IRT_STR);
      IVar1 = (IRRef1)TVar2;
      IVar4 = 0x884;
    }
    else {
      TVar2 = lj_ir_kint(J,0);
      (J->fold).ins.field_0.ot = 0x4009;
      (J->fold).ins.field_0.op1 = (IRRef1)tr;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
      TVar2 = lj_opt_fold(J);
      (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x46100001;
      tr = lj_opt_fold(J);
      TVar2 = lj_ir_kint(J,0x23);
      IVar1 = (IRRef1)TVar2;
      IVar4 = 0x893;
    }
    (J->fold).ins.field_0.ot = IVar4;
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    (J->fold).ins.field_0.op2 = IVar1;
    lj_opt_fold(J);
    iVar3 = 0;
  }
  else {
    iVar3 = argv2int(J,tv);
    if (iVar3 == 0) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
  }
  return iVar3;
}

Assistant:

int32_t lj_ffrecord_select_mode(jit_State *J, TRef tr, TValue *tv)
{
  if (tref_isstr(tr) && *strVdata(tv) == '#') {  /* select('#', ...) */
    if (strV(tv)->len == 1) {
      emitir(IRTG(IR_EQ, IRT_STR), tr, lj_ir_kstr(J, strV(tv)));
    } else {
      TRef trptr = emitir(IRT(IR_STRREF, IRT_PGC), tr, lj_ir_kint(J, 0));
      TRef trchar = emitir(IRT(IR_XLOAD, IRT_U8), trptr, IRXLOAD_READONLY);
      emitir(IRTGI(IR_EQ), trchar, lj_ir_kint(J, '#'));
    }
    return 0;
  } else {  /* select(n, ...) */
    int32_t start = argv2int(J, tv);
    if (start == 0) lj_trace_err(J, LJ_TRERR_BADTYPE);  /* A bit misleading. */
    return start;
  }
}